

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QVersionNumber *version)

{
  anon_union_8_3_e50c5c22_for_SegmentStorage_0 aVar1;
  QDebug *pQVar2;
  QVersionNumber *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QArrayDataPointer<char16_t> QStack_48;
  QDebugStateSaver local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_30,(QDebug *)version);
  *(undefined2 *)((version->m_segments).field_0.dummy + 0x30) = 0x100;
  pQVar2 = QDebug::operator<<((QDebug *)version,"QVersionNumber(");
  QVersionNumber::toString((QString *)&QStack_48,in_RDX);
  pQVar2 = QDebug::operator<<(pQVar2,(QString *)&QStack_48);
  QDebug::operator<<(pQVar2,")");
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  aVar1 = (version->m_segments).field_0;
  (version->m_segments).field_0.dummy = 0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)aVar1;
  QDebugStateSaver::~QDebugStateSaver(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QVersionNumber &version)
{
    QDebugStateSaver saver(debug);
    debug.nospace().noquote();
    debug << "QVersionNumber(" << version.toString() << ")";
    return debug;
}